

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O2

bool __thiscall
Js::BigUInt::FInitFromDigits<char16_t>(BigUInt *this,char16_t *prgch,int32 cch,int32 *pcchDig)

{
  char16_t *pcVar1;
  char16_t cVar2;
  code *pcVar3;
  bool bVar4;
  int clu;
  undefined4 *puVar5;
  uint luMul;
  uint32 luAdd;
  
  AssertValid(this,true);
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x6f,"(cch >= 0)","cch >= 0");
    if (!bVar4) goto LAB_0060a8ac;
    *puVar5 = 0;
  }
  if (prgch == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x70,"(prgch != 0)","prgch != 0");
    if (!bVar4) goto LAB_0060a8ac;
    *puVar5 = 0;
  }
  if (pcchDig == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x71,"(pcchDig != 0)","pcchDig != 0");
    if (!bVar4) goto LAB_0060a8ac;
    *puVar5 = 0;
  }
  clu = (cch + 8) / 9;
  if ((this->m_cluMax < clu) && (bVar4 = FResize(this,clu), !bVar4)) {
    return false;
  }
  this->m_clu = 0;
  pcVar1 = prgch + cch;
  *pcchDig = cch;
  luAdd = 0;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  luMul = 1;
  for (; prgch < pcVar1; prgch = prgch + 1) {
    cVar2 = *prgch;
    if ((cVar2 == L'_') || (cVar2 == L'.')) {
      *pcchDig = *pcchDig + -1;
    }
    else {
      bVar4 = NumberUtilities::IsDigit((uint)(ushort)cVar2);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x85,"(NumberUtilities::IsDigit(*prgch))",
                                    "NumberUtilities::IsDigit(*prgch)");
        if (!bVar4) goto LAB_0060a8ac;
        *puVar5 = 0;
      }
      if (luMul == 1000000000) {
        bVar4 = FMulAdd(this,1000000000,luAdd);
        luAdd = 0;
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x88,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
          if (!bVar4) goto LAB_0060a8ac;
          *puVar5 = 0;
        }
        luMul = 1;
      }
      luMul = luMul * 10;
      luAdd = (luAdd * 10 + (uint)(ushort)*prgch) - 0x30;
    }
  }
  if (luMul < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x8f,"(1 < luMul)","1 < luMul");
    if (!bVar4) goto LAB_0060a8ac;
    *puVar5 = 0;
  }
  bVar4 = FMulAdd(this,luMul,luAdd);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x90,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
    if (!bVar4) {
LAB_0060a8ac:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  AssertValid(this,true);
  return true;
}

Assistant:

bool BigUInt::FInitFromDigits(const EncodedChar *prgch, int32 cch, int32 *pcchDig)
    {
        AssertBi(this);
        Assert(cch >= 0);
        Assert(prgch != 0);
        Assert(pcchDig != 0);

        uint32 luAdd;
        uint32 luMul;
        int32 clu = (cch + 8) / 9;
        const EncodedChar *pchLim = prgch + cch;

        if (clu > m_cluMax && !FResize(clu))
            return false;
        m_clu = 0;

        luAdd = 0;
        luMul = 1;
        for (*pcchDig = cch; prgch < pchLim; prgch++)
        {
            if (*prgch == '.' || *prgch == '_')
            {
                (*pcchDig)--;
                continue;
            }
            Assert(NumberUtilities::IsDigit(*prgch));
            if (luMul == 1000000000)
            {
                AssertVerify(FMulAdd(luMul, luAdd));
                luMul = 1;
                luAdd = 0;
            }
            luMul *= 10;
            luAdd = luAdd * 10 + *prgch - '0';
        }
        Assert(1 < luMul);
        AssertVerify(FMulAdd(luMul, luAdd));

        AssertBi(this);
        return true;
    }